

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O2

Path * __thiscall
ApprovalTests::TemplatedCustomNamer::getReceivedFileAsPath
          (Path *__return_storage_ptr__,TemplatedCustomNamer *this,string *extensionWithDot)

{
  allocator local_41;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"received",&local_41);
  constructFromTemplate(__return_storage_ptr__,this,extensionWithDot,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Path TemplatedCustomNamer::getReceivedFileAsPath(std::string extensionWithDot) const
    {
        return constructFromTemplate(extensionWithDot, "received");
    }